

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

string * backward::TraceResolverLinuxBase::read_symlink
                   (string *__return_storage_ptr__,string *symlink_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  allocator local_41;
  string path;
  
  paVar1 = &path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::resize((ulong)&path);
  do {
    sVar2 = readlink((symlink_path->_M_dataplus)._M_p,path._M_dataplus._M_p,path._M_string_length);
    if ((long)sVar2 < 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
LAB_0010bb4d:
      std::__cxx11::string::~string((string *)&path);
      return __return_storage_ptr__;
    }
    if (sVar2 != path._M_string_length) {
      std::__cxx11::string::resize((ulong)&path);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)path._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(path.field_2._M_allocated_capacity._1_7_,path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = path._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(path.field_2._M_allocated_capacity._1_7_,path.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = path._M_string_length;
      path._M_string_length = 0;
      path.field_2._M_local_buf[0] = '\0';
      path._M_dataplus._M_p = (pointer)paVar1;
      goto LAB_0010bb4d;
    }
    std::__cxx11::string::resize((ulong)&path);
  } while( true );
}

Assistant:

static std::string read_symlink(std::string const &symlink_path) {
    std::string path;
    path.resize(100);

    while (true) {
      ssize_t len =
          ::readlink(symlink_path.c_str(), &*path.begin(), path.size());
      if (len < 0) {
        return "";
      }
      if (static_cast<size_t>(len) == path.size()) {
        path.resize(path.size() * 2);
      } else {
        path.resize(static_cast<std::string::size_type>(len));
        break;
      }
    }

    return path;
  }